

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O1

Array<asl::Var> * __thiscall asl::Array<asl::Var>::resize(Array<asl::Var> *this,int m)

{
  Type TVar1;
  Var *pVVar2;
  Var *pVVar3;
  long lVar4;
  
  TVar1 = this->_a[-1]._type;
  reserve(this,m);
  if ((int)TVar1 < m) {
    pVVar2 = this->_a + (int)TVar1;
    pVVar3 = pVVar2 + (int)(m - TVar1);
    do {
      pVVar2->_type = NONE;
      (pVVar2->field_1)._d = 0.0;
      pVVar2 = pVVar2 + 1;
    } while (pVVar2 != pVVar3);
  }
  else if (m < (int)TVar1) {
    pVVar2 = this->_a + m;
    lVar4 = (long)(int)TVar1 * 0x10 + (long)m * -0x10;
    do {
      Var::~Var(pVVar2);
      pVVar2 = pVVar2 + 1;
      lVar4 = lVar4 + -0x10;
    } while (lVar4 != 0);
  }
  this->_a[-1]._type = m;
  return this;
}

Assistant:

Array& resize(int m)
	{
		int n = d().n;
		reserve(m);
		if (m > n)
			asl_construct(_a + n, m - n);
		else if (m < n)
			asl_destroy(_a + m, n - m);
		d().n = m;
		return *this;
	}